

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

any * __thiscall
Omega_h::InputYamlReader::at_reduce
          (any *__return_storage_ptr__,InputYamlReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  vtable_type *pvVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_type *psVar8;
  long *plVar9;
  InputMap *pIVar10;
  type_info *ptVar11;
  any *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *leading_empties_or_comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  ostream *poVar14;
  ParserFail *this_00;
  undefined8 *puVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  any *paVar17;
  pointer paVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  undefined8 uVar22;
  storage_union *psVar23;
  string ignored_comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_1e8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [8];
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  unsigned_long local_38;
  
  switch(prod) {
  case 0:
  case 1:
    uVar20 = (ulong)(prod == 1);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (uVar20 <= uVar19 && uVar19 - uVar20 != 0) {
      if (paVar18[uVar20].vtable == (vtable_type *)0x0) {
        pcVar21 = "!rhs.at(offset).empty()";
        uVar22 = 0x178;
      }
      else {
        ptVar11 = (*(paVar18[uVar20].vtable)->type)();
        pcVar21 = *(char **)(ptVar11 + 8);
        if ((pcVar21 == "N7Omega_h8InputMapE") ||
           ((*pcVar21 != '*' && (iVar6 = strcmp(pcVar21,"N7Omega_h8InputMapE"), iVar6 == 0)))) {
          psVar23 = &paVar18[uVar20].storage;
          pIVar10 = any_cast<Omega_h::InputMap&>((any *)psVar23);
          (pIVar10->super_Input).used = true;
          __return_storage_ptr__->vtable = (vtable_type *)psVar23[1].dynamic;
          if (psVar23[1].dynamic == (void *)0x0) {
            return __return_storage_ptr__;
          }
          (**(code **)((long)psVar23[1].dynamic + 0x18))(psVar23,&__return_storage_ptr__->storage);
          psVar23[1].dynamic = (void *)0x0;
          return __return_storage_ptr__;
        }
        pcVar21 = "result_any.type() == typeid(InputMap)";
        uVar22 = 0x17a;
      }
LAB_002ef32e:
      fail("assertion %s failed at %s +%d\n",pcVar21,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,uVar22);
    }
    goto LAB_002ef114;
  case 2:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar18;
    if (lVar7 != 0) {
      pvVar1 = paVar18->vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        ptVar11 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar11 = (*pvVar1->type)();
      }
      pcVar21 = *(char **)(ptVar11 + 8);
      if ((pcVar21 != "N7Omega_h9NameValueE") &&
         ((*pcVar21 == '*' || (iVar6 = strcmp(pcVar21,"N7Omega_h9NameValueE"), iVar6 != 0))))
      goto switchD_002ede55_caseD_4;
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18;
      if (lVar7 != 0) {
LAB_002ef0d5:
        map_first_item(__return_storage_ptr__,this,paVar18);
        return __return_storage_ptr__;
      }
    }
    goto LAB_002ef0f9;
  case 3:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (1 < uVar19) {
      pvVar1 = paVar18[1].vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        ptVar11 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar11 = (*pvVar1->type)();
      }
      pcVar21 = *(char **)(ptVar11 + 8);
      if ((pcVar21 == "N7Omega_h9NameValueE") ||
         ((*pcVar21 != '*' && (iVar6 = strcmp(pcVar21,"N7Omega_h9NameValueE"), iVar6 == 0)))) {
        paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar18;
        if (lVar7 != 0) {
          pvVar1 = paVar18->vtable;
          if (pvVar1 == (vtable_type *)0x0) {
            ptVar11 = (type_info *)&void::typeinfo;
          }
          else {
            ptVar11 = (*pvVar1->type)();
          }
          pcVar21 = *(char **)(ptVar11 + 8);
          if ((pcVar21 == "N7Omega_h8InputMapE") ||
             ((*pcVar21 != '*' && (iVar6 = strcmp(pcVar21,"N7Omega_h8InputMapE"), iVar6 == 0)))) {
            paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            lVar7 = (long)paVar17 - (long)paVar12;
            goto LAB_002ee83e;
          }
          paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)paVar18;
          if (lVar7 != 0) goto LAB_002ef0d5;
        }
      }
      else {
        psVar23 = &((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_start)->storage;
        if (&((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish)->storage != psVar23) goto LAB_002ede67;
        lVar7 = 0;
      }
      uVar19 = (lVar7 >> 3) * -0x5555555555555555;
      goto LAB_002ef10b;
    }
    goto LAB_002ef149;
  default:
switchD_002ede55_caseD_4:
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
    break;
  case 7:
  case 0x2b:
  case 0x2d:
  case 0x39:
  case 0x41:
  case 0x53:
  case 0x57:
  case 0x5a:
  case 0x5b:
  case 0x5d:
  case 0x60:
  case 100:
  case 0x71:
    psVar23 = &((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start)->storage;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)psVar23;
    if (lVar7 != 0) {
LAB_002ede67:
      __return_storage_ptr__->vtable = (vtable_type *)psVar23[1].dynamic;
      if (psVar23[1].dynamic == (void *)0x0) {
        return __return_storage_ptr__;
      }
      (**(code **)((long)psVar23[1].dynamic + 0x18))(psVar23,&__return_storage_ptr__->storage);
      psVar23[1].dynamic = (void *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ef0f9;
  case 8:
  case 0x1e:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar18;
    if (lVar7 != 0) {
      pvVar1 = paVar18->vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        ptVar11 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar11 = (*pvVar1->type)();
      }
      pcVar21 = *(char **)(ptVar11 + 8);
      if ((pcVar21 != "N7Omega_h9NameValueE") &&
         ((*pcVar21 == '*' || (iVar6 = strcmp(pcVar21,"N7Omega_h9NameValueE"), iVar6 != 0)))) {
        pcVar21 = "rhs.at(0).type() == typeid(NameValue)";
        uVar22 = 0x195;
        goto LAB_002ef32e;
      }
      paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar12;
      if (lVar7 != 0) {
        map_first_item(__return_storage_ptr__,this,paVar12);
        if (__return_storage_ptr__->vtable == (vtable_type *)0x0) {
          ptVar11 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar11 = (*__return_storage_ptr__->vtable->type)();
        }
        pcVar21 = *(char **)(ptVar11 + 8);
        if (pcVar21 == "N7Omega_h8InputMapE") {
          return __return_storage_ptr__;
        }
        if ((*pcVar21 != '*') && (iVar6 = strcmp(pcVar21,"N7Omega_h8InputMapE"), iVar6 == 0)) {
          return __return_storage_ptr__;
        }
        fail("assertion %s failed at %s +%d\n","result_any.type() == typeid(InputMap)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
             ,0x197);
      }
    }
    goto LAB_002ef0f9;
  case 9:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    lVar7 = (long)paVar17 - (long)paVar12;
LAB_002ee83e:
    uVar19 = (lVar7 >> 3) * -0x5555555555555555;
    if (paVar17 != paVar12) {
      if (1 < uVar19) {
        paVar17 = paVar12 + 1;
LAB_002ee855:
        map_next_item(__return_storage_ptr__,this,paVar12,paVar17);
        return __return_storage_ptr__;
      }
      goto LAB_002ef149;
    }
    goto LAB_002ef10b;
  case 10:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x20:
  case 0x21:
  case 0x22:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = ((long)paVar17 - (long)paVar12 >> 3) * -0x5555555555555555;
    if (paVar17 == paVar12) goto LAB_002ef10b;
    if (4 < uVar19) {
      paVar17 = paVar12 + 4;
LAB_002edf13:
      map_item(__return_storage_ptr__,this,paVar12,paVar17);
      return __return_storage_ptr__;
    }
    goto LAB_002ef157;
  case 0xb:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = ((long)paVar17 - (long)paVar12 >> 3) * -0x5555555555555555;
    if (paVar17 == paVar12) goto LAB_002ef10b;
    if (3 < uVar19) {
      paVar17 = paVar12 + 3;
      goto LAB_002edf13;
    }
    goto LAB_002ef165;
  case 0xd:
    local_1a8._M_left = &local_1a8;
    auStack_1b0 = (undefined1  [8])0x0;
    local_188 = 0;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = 0;
    local_1c8._0_8_ = &PTR__InputMap_004c5848;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._M_parent = (_Base_ptr)0x0;
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::InputMap>()::table
    ;
    local_1a8._M_right = local_1a8._M_left;
    any::do_construct<Omega_h::InputMap,Omega_h::InputMap>
              (__return_storage_ptr__,(InputMap *)local_1c8);
    goto LAB_002ee972;
  case 0xe:
  case 0xf:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x3c:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (1 < uVar19) {
      __return_storage_ptr__->vtable = paVar18[1].vtable;
      if (paVar18[1].vtable == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*(paVar18[1].vtable)->move)(&paVar18[1].storage,&__return_storage_ptr__->storage);
      paVar18[1].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ef149;
  case 0x12:
  case 0x25:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar12;
    if (lVar7 != 0) {
      seq_first_item(__return_storage_ptr__,this,paVar12);
      return __return_storage_ptr__;
    }
    goto LAB_002ef0f9;
  case 0x13:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = ((long)paVar17 - (long)paVar12 >> 3) * -0x5555555555555555;
    if (paVar17 == paVar12) goto LAB_002ef10b;
    if (1 < uVar19) {
      paVar17 = paVar12 + 1;
LAB_002eeb35:
      seq_next_item(__return_storage_ptr__,this,paVar12,paVar17);
      return __return_storage_ptr__;
    }
    goto LAB_002ef149;
  case 0x14:
  case 0x16:
  case 0x18:
  case 0x1a:
  case 0x1b:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (3 < uVar19) {
      __return_storage_ptr__->vtable = paVar18[3].vtable;
      if (paVar18[3].vtable == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*(paVar18[3].vtable)->move)(&paVar18[3].storage,&__return_storage_ptr__->storage);
      paVar18[3].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ef165;
  case 0x15:
  case 0x1c:
  case 0x23:
  case 0x37:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (2 < uVar19) {
      __return_storage_ptr__->vtable = paVar18[2].vtable;
      if (paVar18[2].vtable == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*(paVar18[2].vtable)->move)(&paVar18[2].storage,&__return_storage_ptr__->storage);
      paVar18[2].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
LAB_002ef239:
    uVar20 = 2;
    goto LAB_002ef114;
  case 0x17:
  case 0x19:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (4 < uVar19) {
      __return_storage_ptr__->vtable = paVar18[4].vtable;
      if (paVar18[4].vtable == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*(paVar18[4].vtable)->move)(&paVar18[4].storage,&__return_storage_ptr__->storage);
      paVar18[4].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ef157;
  case 0x1d:
    local_1a8._M_left = &local_1a8;
    auStack_1b0 = (undefined1  [8])0x0;
    local_188 = 0;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = 0;
    local_1c8._0_8_ = &PTR__InputMap_004c5848;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._M_parent = (_Base_ptr)0x0;
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::InputMap>()::table
    ;
    local_1a8._M_right = local_1a8._M_left;
    any::do_construct<Omega_h::InputMap,Omega_h::InputMap>
              (__return_storage_ptr__,(InputMap *)local_1c8);
LAB_002ee972:
    local_1c8._0_8_ = &PTR__InputMap_004c5848;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
                 *)auStack_1b0);
    break;
  case 0x1f:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = ((long)paVar17 - (long)paVar12 >> 3) * -0x5555555555555555;
    if (paVar17 == paVar12) goto LAB_002ef10b;
    if (3 < uVar19) {
      paVar17 = paVar12 + 3;
      goto LAB_002ee855;
    }
    goto LAB_002ef165;
  case 0x24:
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = 0;
    local_1c8._0_8_ = &PTR__InputList_004c5870;
    auStack_1b0 = (undefined1  [8])0x0;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._M_parent = (_Base_ptr)0x0;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<Omega_h::InputList>()::table;
    any::do_construct<Omega_h::InputList,Omega_h::InputList>
              (__return_storage_ptr__,(InputList *)local_1c8);
    local_1c8._0_8_ = &PTR__InputList_004c5870;
    std::vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ::~vector((vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
               *)auStack_1b0);
    break;
  case 0x26:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar17 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = ((long)paVar17 - (long)paVar12 >> 3) * -0x5555555555555555;
    if (paVar17 == paVar12) goto LAB_002ef10b;
    if (3 < uVar19) {
      paVar17 = paVar12 + 3;
      goto LAB_002eeb35;
    }
LAB_002ef165:
    uVar20 = 3;
    goto LAB_002ef114;
  case 0x2a:
  case 0x2c:
    pcVar4 = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_1c8._0_8_ = pcVar4;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar12) {
      uVar19 = 0;
      uVar22 = 0;
LAB_002ef3e9:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar22,
                 uVar19);
    }
    if (paVar12->vtable == (vtable_type *)0x0) {
      fail("assertion %s failed at %s +%d\n","!rhs.at(0).empty()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x1fb);
    }
    pbVar13 = any_cast<std::__cxx11::string&&>(paVar12);
    std::__cxx11::string::operator=((string *)local_1c8,(string *)pbVar13);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (uVar19 < 2) {
      uVar22 = 1;
      goto LAB_002ef3e9;
    }
    pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 1);
    std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
    if (prod == 0x2c) {
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555
      ;
      if (uVar19 < 3) {
        uVar22 = 2;
        goto LAB_002ef3e9;
      }
      pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 2);
      std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
    }
    remove_trailing_whitespace(&local_1e8,(string *)local_1c8);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    puVar15 = (undefined8 *)operator_new(0x20);
    *puVar15 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) {
      puVar15[2] = CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                            local_1e8.field_2._M_local_buf[0]);
      puVar15[3] = local_1e8.field_2._8_8_;
    }
    else {
      *puVar15 = local_1e8._M_dataplus._M_p;
      puVar15[2] = CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                            local_1e8.field_2._M_local_buf[0]);
    }
    puVar15[1] = local_1e8._M_string_length;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->storage).dynamic = puVar15;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    if ((pointer)local_1c8._0_8_ == pcVar4) {
      return __return_storage_ptr__;
    }
LAB_002ef084:
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    break;
  case 0x2e:
  case 0x2f:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (1 < uVar19) {
      pbVar13 = any_cast<std::__cxx11::string&&>(paVar18 + 1);
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar4 = (pbVar13->_M_dataplus)._M_p;
      paVar16 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar16) {
        local_1c8._16_8_ = paVar16->_M_allocated_capacity;
        auStack_1b0 = *(undefined1 (*) [8])((long)&pbVar13->field_2 + 8);
      }
      else {
        local_1c8._16_8_ = paVar16->_M_allocated_capacity;
        local_1c8._0_8_ = pcVar4;
      }
      local_1c8._8_8_ = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
                 -0x5555555555555555) < 3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
      }
      pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 2);
      std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar9 = (long *)operator_new(0x20);
      goto LAB_002eefe0;
    }
LAB_002ef149:
    uVar20 = 1;
    goto LAB_002ef114;
  case 0x30:
    uVar20 = 0;
    goto LAB_002eebe1;
  case 0x31:
  case 0x32:
    uVar20 = 1;
    goto LAB_002eebe1;
  case 0x33:
    uVar20 = 2;
LAB_002eebe1:
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (uVar19 < uVar20 || uVar19 - uVar20 == 0) goto LAB_002ef114;
    bVar5 = any::is_typed(paVar18 + uVar20,(type_info *)&char::typeinfo);
    if (!bVar5) {
LAB_002ef11b:
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = &PTR__bad_cast_004c4678;
      __cxa_throw(puVar15,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pcVar4 = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = local_1c8._16_8_ & 0xffffffffffffff00;
    local_1c8._0_8_ = pcVar4;
    if (prod == 0x33) {
      std::__cxx11::string::append(local_1c8);
    }
    else if ((prod == 0x32) || (prod == 0x31)) {
      std::__cxx11::string::push_back((char)local_1c8);
    }
    std::__cxx11::string::push_back((char)local_1c8);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
    *plVar9 = (long)(plVar9 + 2);
    if ((pointer)local_1c8._0_8_ == pcVar4) {
      plVar9[2] = local_1c8._16_8_;
      plVar9[3] = (long)auStack_1b0;
    }
    else {
      *plVar9 = local_1c8._0_8_;
      plVar9[2] = local_1c8._16_8_;
    }
    plVar9[1] = local_1c8._8_8_;
    goto LAB_002ef025;
  case 0x34:
  case 0x3f:
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4c:
  case 0x4f:
  case 0x72:
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
    *plVar9 = (long)(plVar9 + 2);
    plVar9[2] = local_1c8._16_8_;
    plVar9[3] = (long)auStack_1b0;
    plVar9[1] = 0;
    goto LAB_002ef025;
  case 0x35:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar12;
    if (lVar7 != 0) {
      pbVar13 = any_cast<std::__cxx11::string&&>(paVar12);
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar4 = (pbVar13->_M_dataplus)._M_p;
      paVar16 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar16) {
        local_1c8._16_8_ = paVar16->_M_allocated_capacity;
        auStack_1b0 = *(undefined1 (*) [8])((long)&pbVar13->field_2 + 8);
      }
      else {
        local_1c8._16_8_ = paVar16->_M_allocated_capacity;
        local_1c8._0_8_ = pcVar4;
      }
      local_1c8._8_8_ = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)local_1c8);
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
                 -0x5555555555555555) < 3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
      }
      pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 2);
      std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar9 = (long *)operator_new(0x20);
      goto LAB_002eefe0;
    }
    goto LAB_002ef0f9;
  case 0x38:
    puVar3 = (this->super_Reader).symbol_indentation_stack.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = (long)(this->super_Reader).symbol_indentation_stack.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
    if (uVar19 < 5) {
      uVar20 = uVar19 - 5;
      goto LAB_002ef114;
    }
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar12) {
      uVar19 = 0;
      goto LAB_002ef10b;
    }
    local_38 = puVar3[uVar19 - 5];
    pbVar13 = any_cast<std::__cxx11::string&>(paVar12);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (uVar19 < 3) goto LAB_002ef239;
    leading_empties_or_comments = any_cast<std::__cxx11::string&>(paVar18 + 2);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar18 >> 3) * -0x5555555555555555;
    if (4 < uVar19) {
      rest = any_cast<std::__cxx11::string&>(paVar18 + 4);
      pcVar4 = local_1c8 + 0x10;
      local_1c8._8_8_ = (Input *)0x0;
      local_1c8._16_8_ = local_1c8._16_8_ & 0xffffffffffffff00;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      local_1c8._0_8_ = pcVar4;
      handle_block_scalar(this,local_38,pbVar13,leading_empties_or_comments,rest,(string *)local_1c8
                          ,&local_1e8);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar9 = (long *)operator_new(0x20);
      *plVar9 = (long)(plVar9 + 2);
      if ((pointer)local_1c8._0_8_ == pcVar4) {
        plVar9[2] = local_1c8._16_8_;
        plVar9[3] = (long)auStack_1b0;
      }
      else {
        *plVar9 = local_1c8._0_8_;
        plVar9[2] = local_1c8._16_8_;
      }
      plVar9[1] = local_1c8._8_8_;
      local_1c8._8_8_ = (Input *)0x0;
      local_1c8._16_8_ = local_1c8._16_8_ & 0xffffffffffffff00;
      (__return_storage_ptr__->storage).dynamic = plVar9;
      local_1c8._0_8_ = pcVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_1c8._0_8_ == pcVar4) {
        return __return_storage_ptr__;
      }
      goto LAB_002ef084;
    }
LAB_002ef157:
    uVar20 = 4;
    goto LAB_002ef114;
  case 0x3a:
  case 0x3b:
  case 0x4a:
  case 0x4d:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar12;
    if (lVar7 != 0) {
      bVar5 = any::is_typed(paVar12,(type_info *)&std::__cxx11::string::typeinfo);
      puVar15 = (undefined8 *)(paVar12->storage).dynamic;
      if (!bVar5 || puVar15 == (undefined8 *)0x0) goto LAB_002ef11b;
      local_1c8._0_8_ = local_1c8 + 0x10;
      psVar8 = puVar15 + 2;
      if ((size_type *)*puVar15 == psVar8) {
        local_1c8._16_8_ = *psVar8;
        auStack_1b0 = (undefined1  [8])puVar15[3];
      }
      else {
        local_1c8._16_8_ = *psVar8;
        local_1c8._0_8_ = (size_type *)*puVar15;
      }
      local_1c8._8_8_ = puVar15[1];
      *puVar15 = psVar8;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
                 -0x5555555555555555) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      paVar12 = paVar18 + 1;
      bVar5 = any::is_typed(paVar12,(type_info *)&std::__cxx11::string::typeinfo);
      puVar2 = (ulong *)(paVar12->storage).dynamic;
      if (!bVar5 || puVar2 == (ulong *)0x0) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = &PTR__bad_cast_004c4678;
        __cxa_throw(puVar15,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      std::__cxx11::string::_M_append(local_1c8,*puVar2);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar9 = (long *)operator_new(0x20);
      goto LAB_002ee759;
    }
    goto LAB_002ef0f9;
  case 0x3d:
  case 0x3e:
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    std::__cxx11::string::append(local_1c8);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
               -0x5555555555555555) < 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 1);
    std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
    goto LAB_002eefe0;
  case 0x40:
  case 0x44:
  case 0x46:
  case 0x48:
  case 0x50:
  case 0x73:
  case 0x75:
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar7 = (long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar12;
    if (lVar7 != 0) {
      if (paVar12->vtable == (vtable_type *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 0x10),"leading characters in ",0x16);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)(local_1c8 + 0x10),prod);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": any was empty\n",0x10);
        this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        ParserFail::ParserFail(this_00,&local_1e8);
        __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      bVar5 = any::is_typed(paVar12,(type_info *)&std::__cxx11::string::typeinfo);
      puVar15 = (undefined8 *)(paVar12->storage).dynamic;
      if (!bVar5 || puVar15 == (undefined8 *)0x0) goto LAB_002ef11b;
      local_1c8._0_8_ = local_1c8 + 0x10;
      psVar8 = puVar15 + 2;
      if ((size_type *)*puVar15 == psVar8) {
        local_1c8._16_8_ = *psVar8;
        auStack_1b0 = (undefined1  [8])puVar15[3];
      }
      else {
        local_1c8._16_8_ = *psVar8;
        local_1c8._0_8_ = (size_type *)*puVar15;
      }
      local_1c8._8_8_ = puVar15[1];
      *puVar15 = psVar8;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
                 -0x5555555555555555) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      bVar5 = any::is_typed(paVar18 + 1,(type_info *)&char::typeinfo);
      if (!bVar5) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = &PTR__bad_cast_004c4678;
        __cxa_throw(puVar15,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      std::__cxx11::string::push_back((char)local_1c8);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar9 = (long *)operator_new(0x20);
      goto LAB_002ee759;
    }
LAB_002ef0f9:
    uVar19 = (lVar7 >> 3) * -0x5555555555555555;
LAB_002ef10b:
    uVar20 = 0;
LAB_002ef114:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20,
               uVar19);
  case 0x42:
  case 0x55:
  case 0x67:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2d;
    break;
  case 0x4b:
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
               -0x5555555555555555) < 3) {
      uVar22 = 2;
LAB_002ef3c3:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar22)
      ;
    }
    pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 2);
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
               -0x5555555555555555) < 2) {
      uVar22 = 1;
      goto LAB_002ef3c3;
    }
    any_cast<char>(paVar18 + 1);
    std::__cxx11::string::push_back((char)local_1c8);
    std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
LAB_002ee759:
    *plVar9 = (long)(plVar9 + 2);
    if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
      plVar9[2] = local_1c8._16_8_;
      plVar9[3] = (long)auStack_1b0;
    }
    else {
      *plVar9 = local_1c8._0_8_;
      plVar9[2] = local_1c8._16_8_;
    }
    plVar9[1] = local_1c8._8_8_;
    goto LAB_002ef025;
  case 0x4e:
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    paVar18 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar18 >> 3) *
               -0x5555555555555555) < 3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    }
    pbVar13 = any_cast<std::__cxx11::string&>(paVar18 + 2);
    std::__cxx11::string::push_back((char)local_1c8);
    std::__cxx11::string::_M_append(local_1c8,(ulong)(pbVar13->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
    goto LAB_002eefe0;
  case 0x51:
  case 0x74:
    local_1c8._0_8_ = local_1c8 + 0x10;
    local_1c8._8_8_ = (Input *)0x0;
    local_1c8._16_8_ = (ulong)(uint7)local_1c8._17_7_ << 8;
    paVar12 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar12) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    any_cast<char>(paVar12);
    std::__cxx11::string::push_back((char)local_1c8);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar9 = (long *)operator_new(0x20);
LAB_002eefe0:
    *plVar9 = (long)(plVar9 + 2);
    if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
      plVar9[2] = local_1c8._16_8_;
      plVar9[3] = (long)auStack_1b0;
    }
    else {
      *plVar9 = local_1c8._0_8_;
      plVar9[2] = local_1c8._16_8_;
    }
    plVar9[1] = local_1c8._8_8_;
LAB_002ef025:
    (__return_storage_ptr__->storage).dynamic = plVar9;
    break;
  case 0x54:
  case 0x66:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2e;
    break;
  case 0x56:
  case 0x5c:
  case 0x62:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x27;
    break;
  case 0x58:
  case 0x5e:
  case 0x61:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x22;
    break;
  case 0x59:
  case 0x5f:
  case 99:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5c;
    break;
  case 0x65:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3a;
    break;
  case 0x68:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7c;
    break;
  case 0x69:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5b;
    break;
  case 0x6a:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5d;
    break;
  case 0x6b:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7b;
    break;
  case 0x6c:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7d;
    break;
  case 0x6d:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3e;
    break;
  case 0x6e:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2c;
    break;
  case 0x6f:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x25;
    break;
  case 0x70:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x21;
  }
  return __return_storage_ptr__;
}

Assistant:

any at_reduce(int prod, std::vector<any>& rhs) override final {
    switch (prod) {
      case yaml::PROD_DOC:
      case yaml::PROD_DOC2: {
        std::size_t offset = prod == yaml::PROD_DOC2 ? 1 : 0;
        OMEGA_H_CHECK(!rhs.at(offset).empty());
        auto& result_any = rhs.at(offset);
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        auto& map = any_cast<InputMap&>(result_any);
        map.used = true;
        return any(std::move(result_any));
      }
      case yaml::PROD_TOP_BMAP: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_TOP_FIRST: {
        if (rhs.at(0).type() == typeid(NameValue)) {
          return map_first_item(rhs.at(0));
        }
        return any();
      }
      case yaml::PROD_TOP_NEXT: {
        if (rhs.at(1).type() == typeid(NameValue)) {
          if (rhs.at(0).type() == typeid(InputMap)) {
            return map_next_item(rhs.at(0), rhs.at(1));
          } else {
            return map_first_item(rhs.at(0));
          }
        } else {
          return any(std::move(rhs.at(0)));
        }
      }
      case yaml::PROD_BMAP_FIRST:
      case yaml::PROD_FMAP_FIRST: {
        OMEGA_H_CHECK(rhs.at(0).type() == typeid(NameValue));
        auto result_any = map_first_item(rhs.at(0));
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        return result_any;
      }
      case yaml::PROD_BMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_FMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_SCALAR:
      case yaml::PROD_FMAP_SCALAR: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_BSCALAR: {
        return map_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_BVALUE: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BVALUE_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_BVALUE_BMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BVALUE_BSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_BSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_BSEQ_SCALAR: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSCALAR: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSEQ_BMAP:
      case yaml::PROD_BSEQ_FMAP: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BMAP_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_BSEQ_BSEQ:
      case yaml::PROD_BSEQ_FSEQ: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSEQ_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_FMAP: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FMAP_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_FSEQ: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FSEQ_EMPTY: {
        return InputList();
      }
      case yaml::PROD_FSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_FSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_FSEQ_SCALAR: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_SCALAR_QUOTED:
      case yaml::PROD_MAP_SCALAR_QUOTED: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_SCALAR_RAW:
      case yaml::PROD_MAP_SCALAR_RAW: {
        std::string text;
        OMEGA_H_CHECK(!rhs.at(0).empty());
        text = any_cast<std::string&&>(std::move(rhs.at(0)));
        text += any_cast<std::string&>(rhs.at(1));
        if (prod == yaml::PROD_MAP_SCALAR_RAW) {
          text += any_cast<std::string&>(rhs.at(2));
        }
        return remove_trailing_whitespace(text);
      }
      case yaml::PROD_SCALAR_HEAD_OTHER:
      case yaml::PROD_SCALAR_HEAD_DOT:
      case yaml::PROD_SCALAR_HEAD_DASH:
      case yaml::PROD_SCALAR_HEAD_DOT_DOT: {
        std::size_t offset;
        if (prod == yaml::PROD_SCALAR_HEAD_OTHER)
          offset = 0;
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          offset = 2;
        else
          offset = 1;
        char second = any_cast<char>(rhs.at(offset));
        std::string result;
        if (prod == yaml::PROD_SCALAR_HEAD_DOT)
          result += '.';
        else if (prod == yaml::PROD_SCALAR_HEAD_DASH)
          result += '-';
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          result += "..";
        result += second;
        return any(std::move(result));
      }
      case yaml::PROD_SCALAR_DQUOTED:
      case yaml::PROD_SCALAR_SQUOTED: {
        auto text = any_cast<std::string&&>(std::move(rhs.at(1)));
        text += any_cast<std::string&>(rhs.at(2));
        return any(std::move(text));
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_EMPTY: {
        return std::string();
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += ',';
        str += any_cast<std::string&>(rhs.at(2));
        return any(std::move(str));
      }
      case yaml::PROD_TAG: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSCALAR: {
        auto parent_indent_level = this->symbol_indentation_stack.at(
            this->symbol_indentation_stack.size() - 5);
        auto& header = any_cast<std::string&>(rhs.at(0));
        auto& leading_empties_or_comments = any_cast<std::string&>(rhs.at(2));
        auto& rest = any_cast<std::string&>(rhs.at(4));
        std::string content;
        std::string ignored_comment;
        handle_block_scalar(parent_indent_level, header,
            leading_empties_or_comments, rest, content, ignored_comment);
        return any(std::move(content));
      }
      case yaml::PROD_BSCALAR_FIRST: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to concatenating two strings
      case yaml::PROD_BSCALAR_NEXT:
      case yaml::PROD_BSCALAR_LINE:
      case yaml::PROD_DESCAPE_NEXT:
      case yaml::PROD_SESCAPE_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<std::string&>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_BSCALAR_INDENT: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BSCALAR_HEADER_LITERAL:
      case yaml::PROD_BSCALAR_HEADER_FOLDED: {
        std::string result;
        if (prod == yaml::PROD_BSCALAR_HEADER_LITERAL) {
          result += "|";
        } else {
          result += ">";
        }
        auto& rest = any_cast<std::string&>(rhs.at(1));
        result += rest;
        return any(std::move(result));
      }
      case yaml::PROD_DESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += any_cast<char>(rhs.at(1));
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_SESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += '\'';
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_OTHER_FIRST:
      case yaml::PROD_SPACE_PLUS_FIRST: {
        std::string str;
        str.push_back(any_cast<char>(rhs.at(0)));
        return any(std::move(str));
      }
      case yaml::PROD_SCALAR_TAIL_SPACE:
      case yaml::PROD_SCALAR_TAIL_OTHER:
      case yaml::PROD_DESCAPED_DQUOTED:
      case yaml::PROD_DQUOTED_COMMON:
      case yaml::PROD_SQUOTED_COMMON:
      case yaml::PROD_ANY_COMMON:
      case yaml::PROD_COMMON_SPACE:
      case yaml::PROD_COMMON_OTHER:
      case yaml::PROD_BSCALAR_HEAD_OTHER: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to appending a character
      case yaml::PROD_DQUOTED_NEXT:
      case yaml::PROD_SQUOTED_NEXT:
      case yaml::PROD_ANY_NEXT:
      case yaml::PROD_SCALAR_TAIL_NEXT:
      case yaml::PROD_SPACE_STAR_NEXT:
      case yaml::PROD_SPACE_PLUS_NEXT:
      case yaml::PROD_BSCALAR_HEAD_NEXT: {
        if (rhs.at(0).empty()) {
          std::stringstream ss;
          ss << "leading characters in " << prod << ": any was empty\n";
          throw ParserFail(ss.str());
        }
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<char>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_DQUOTED_EMPTY:
      case yaml::PROD_SQUOTED_EMPTY:
      case yaml::PROD_ANY_EMPTY:
      case yaml::PROD_DESCAPE_EMPTY:
      case yaml::PROD_SESCAPE_EMPTY:
      case yaml::PROD_SCALAR_TAIL_EMPTY:
      case yaml::PROD_SPACE_STAR_EMPTY:
      case yaml::PROD_BSCALAR_HEAD_EMPTY: {
        return std::string();
      }
      case yaml::PROD_DESCAPED_DQUOT:
      case yaml::PROD_SQUOTED_DQUOT:
      case yaml::PROD_ANY_DQUOT: {
        return '"';
      }
      case yaml::PROD_DESCAPED_SLASH:
      case yaml::PROD_SQUOTED_SLASH:
      case yaml::PROD_ANY_SLASH: {
        return '\\';
      }
      case yaml::PROD_SCALAR_TAIL_SQUOT:
      case yaml::PROD_DQUOTED_SQUOT:
      case yaml::PROD_ANY_SQUOT: {
        return '\'';
      }
      case yaml::PROD_COMMON_COLON: {
        return ':';
      }
      case yaml::PROD_SCALAR_TAIL_DOT:
      case yaml::PROD_COMMON_DOT: {
        return '.';
      }
      case yaml::PROD_SCALAR_TAIL_DASH:
      case yaml::PROD_COMMON_DASH:
      case yaml::PROD_BSCALAR_HEAD_DASH: {
        return '-';
      }
      case yaml::PROD_COMMON_PIPE: {
        return '|';
      }
      case yaml::PROD_COMMON_LSQUARE: {
        return '[';
      }
      case yaml::PROD_COMMON_RSQUARE: {
        return ']';
      }
      case yaml::PROD_COMMON_LCURLY: {
        return '{';
      }
      case yaml::PROD_COMMON_RCURLY: {
        return '}';
      }
      case yaml::PROD_COMMON_RANGLE: {
        return '>';
      }
      case yaml::PROD_COMMON_COMMA: {
        return ',';
      }
      case yaml::PROD_COMMON_PERCENT: {
        return '%';
      }
      case yaml::PROD_COMMON_EXCL: {
        return '!';
      }
    }
    return any();
  }